

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

ostream * std::operator<<(ostream *ofs,Path *v)

{
  Path *in_RDX;
  string local_30;
  
  tinyusdz::(anonymous_namespace)::pquote_abi_cxx11_(&local_30,(_anonymous_namespace_ *)v,in_RDX);
  std::__ostream_insert<char,std::char_traits<char>>
            (ofs,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Path &v) {
  ofs << tinyusdz::pquote(v);

  return ofs;
}